

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_rock_sample.cpp
# Opt level: O3

void __thiscall despot::BaseRockSample::BaseRockSample(BaseRockSample *this,string *map)

{
  BaseRockSample *pBVar1;
  istream *piVar2;
  int *piVar3;
  uint uVar4;
  BaseRockSample *this_00;
  uint uVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  char tok;
  string tmp;
  ifstream fin;
  char local_291;
  BaseRockSample *local_290;
  vector<despot::Coord,_std::allocator<despot::Coord>_> *local_288;
  vector<int,_std::allocator<int>_> *local_280;
  int local_278;
  undefined4 uStack_274;
  undefined1 *local_270;
  undefined8 local_268;
  undefined1 local_260;
  undefined7 uStack_25f;
  BeliefMDP *local_250;
  ulong local_248;
  Coord *local_240;
  istream local_238 [520];
  
  *(code **)this = despot::TrivialParticleUpperBound::TrivialParticleUpperBound;
  *(undefined8 *)&this->field_0x8 = 0;
  *(undefined8 *)&this->field_0x10 = 0;
  *(undefined8 *)&this->field_0x18 = 0;
  *(undefined8 *)&this->field_0x20 = 0;
  *(undefined8 *)&this->field_0x28 = 0;
  *(undefined8 *)&this->field_0x30 = 0;
  local_290 = this;
  despot::BeliefMDP::BeliefMDP(&this->super_BeliefMDP);
  *(undefined ***)this = &PTR__BaseRockSample_0011a410;
  *(undefined ***)&this->super_BeliefMDP = &PTR__BaseRockSample_0011a528;
  *(undefined ***)&this->super_StateIndexer = &PTR__BaseRockSample_0011a630;
  *(undefined ***)&this->super_StatePolicy = &PTR__BaseRockSample_0011a668;
  local_280 = &(this->grid_).grid_;
  local_288 = &this->rock_pos_;
  local_240 = &this->start_pos_;
  (this->grid_).grid_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->grid_).grid_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->grid_).grid_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->rock_pos_).super__Vector_base<despot::Coord,_std::allocator<despot::Coord>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->rock_pos_).super__Vector_base<despot::Coord,_std::allocator<despot::Coord>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->rock_pos_).super__Vector_base<despot::Coord,_std::allocator<despot::Coord>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  despot::Coord::Coord(local_240);
  (this->memory_pool_).freelist_.
  super__Vector_base<despot::RockSampleState_*,_std::allocator<despot::RockSampleState_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->memory_pool_).freelist_.
  super__Vector_base<despot::RockSampleState_*,_std::allocator<despot::RockSampleState_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->memory_pool_).chunks_.
  super__Vector_base<despot::MemoryPool<despot::RockSampleState>::Chunk_*,_std::allocator<despot::MemoryPool<despot::RockSampleState>::Chunk_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->memory_pool_).freelist_.
  super__Vector_base<despot::RockSampleState_*,_std::allocator<despot::RockSampleState_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->memory_pool_).chunks_.
  super__Vector_base<despot::MemoryPool<despot::RockSampleState>::Chunk_*,_std::allocator<despot::MemoryPool<despot::RockSampleState>::Chunk_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->memory_pool_).chunks_.
  super__Vector_base<despot::MemoryPool<despot::RockSampleState>::Chunk_*,_std::allocator<despot::MemoryPool<despot::RockSampleState>::Chunk_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->memory_pool_).num_allocated_ = 0;
  (this->states_).
  super__Vector_base<despot::RockSampleState_*,_std::allocator<despot::RockSampleState_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->states_).
  super__Vector_base<despot::RockSampleState_*,_std::allocator<despot::RockSampleState_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->states_).
  super__Vector_base<despot::RockSampleState_*,_std::allocator<despot::RockSampleState_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->transition_probabilities_).
  super__Vector_base<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->transition_probabilities_).
  super__Vector_base<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->transition_probabilities_).
  super__Vector_base<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->alpha_vectors_).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->alpha_vectors_).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->alpha_vectors_).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mdp_policy_).
  super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mdp_policy_).
  super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mdp_policy_).
  super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_250 = &this->super_BeliefMDP;
  std::ifstream::ifstream(local_238,(map->_M_dataplus)._M_p,_S_in);
  local_270 = &local_260;
  local_268 = 0;
  local_260 = 0;
  piVar2 = std::operator>>(local_238,(string *)&local_270);
  piVar2 = std::operator>>(piVar2,(string *)&local_270);
  piVar3 = &local_290->size_;
  piVar2 = (istream *)std::istream::operator>>(piVar2,piVar3);
  std::istream::operator>>(piVar2,piVar3);
  uVar4 = *piVar3;
  if (0 < (int)uVar4) {
    uVar5 = uVar4;
    do {
      local_248 = (ulong)uVar5;
      uVar5 = uVar5 - 1;
      if (0 < (int)uVar4) {
        iVar6 = 0;
        do {
          std::operator>>(local_238,&local_291);
          if (local_291 == '-') {
            despot::Coord::Coord((Coord *)&local_278,iVar6,uVar5);
            std::vector<despot::Coord,_std::allocator<despot::Coord>_>::emplace_back<despot::Coord>
                      (local_288,(Coord *)&local_278);
          }
          else if (local_291 == 'R') {
            despot::Coord::Coord((Coord *)&local_278,iVar6,uVar5);
            *(ulong *)local_240 = CONCAT44(uStack_274,local_278);
          }
          iVar6 = iVar6 + 1;
          uVar4 = *piVar3;
        } while (iVar6 < (int)uVar4);
      }
    } while (1 < (int)local_248);
  }
  pBVar1 = local_290;
  local_290->num_rocks_ =
       (int)((ulong)((long)(local_290->rock_pos_).
                           super__Vector_base<despot::Coord,_std::allocator<despot::Coord>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                    (long)(local_290->rock_pos_).
                          super__Vector_base<despot::Coord,_std::allocator<despot::Coord>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 3);
  (local_290->grid_).xsize_ = uVar4;
  (local_290->grid_).ysize_ = uVar4;
  std::vector<int,_std::allocator<int>_>::resize(local_280,(ulong)(uVar4 * uVar4));
  local_278 = -1;
  Grid<int>::SetAllValues(&pBVar1->grid_,&local_278);
  this_00 = pBVar1;
  if (0 < pBVar1->num_rocks_) {
    lVar7 = 0;
    lVar8 = 0;
    do {
      piVar3 = Grid<int>::operator()
                         (&pBVar1->grid_,
                          (local_288->
                          super__Vector_base<despot::Coord,_std::allocator<despot::Coord>_>)._M_impl
                          .super__Vector_impl_data._M_start + lVar7);
      *piVar3 = (int)lVar8;
      lVar8 = lVar8 + 1;
      lVar7 = lVar7 + 8;
      this_00 = local_290;
    } while (lVar8 < local_290->num_rocks_);
  }
  InitStates(this_00);
  if (local_270 != &local_260) {
    operator_delete(local_270,CONCAT71(uStack_25f,local_260) + 1);
  }
  std::ifstream::~ifstream(local_238);
  return;
}

Assistant:

BaseRockSample::BaseRockSample(string map) {
	ifstream fin(map.c_str(), ifstream::in);
	string tmp;
	fin >> tmp >> tmp >> size_ >> size_;

	char tok;
	for (int r = size_ - 1; r >= 0; r--) {
		for (int c = 0; c < size_; c++) {
			fin >> tok;
			if (tok == 'R')
				start_pos_ = Coord(c, r);
			else if (tok == '-') {
				rock_pos_.push_back(Coord(c, r));
			}
		}
	}
	num_rocks_ = rock_pos_.size();

	grid_.Resize(size_, size_);
	grid_.SetAllValues(-1);
	for (int i = 0; i < num_rocks_; ++i) {
		grid_(rock_pos_[i]) = i;
	}

	InitStates();

	/*
	 clock_t start = clock();
	 cerr << "Initializing transitions" << endl;
	 InitializeTransitions();
	 cerr << "Done " << (double (clock() - start) / CLOCKS_PER_SEC) << endl;
	 ComputeOptimalPolicyUsingVI();
	 */
}